

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O2

FT_ULong hash_str_lookup(FT_Hashkey *key)

{
  FT_ULong FVar1;
  char *pcVar2;
  
  FVar1 = 0;
  for (pcVar2 = key->str; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    FVar1 = FVar1 * 0x1f + (long)*pcVar2;
  }
  return FVar1;
}

Assistant:

static FT_ULong
  hash_str_lookup( FT_Hashkey*  key )
  {
    const char*  kp  = key->str;
    FT_ULong     res = 0;


    /* Mocklisp hash function. */
    while ( *kp )
      res = ( res << 5 ) - res + (FT_ULong)*kp++;

    return res;
  }